

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool libcellml::hasComponentImports(ComponentEntityConstPtr *componentEntity)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ComponentPtr childComponent;
  ComponentEntity local_50;
  ComponentEntityConstPtr local_40;
  
  sVar3 = ComponentEntity::componentCount
                    ((componentEntity->
                     super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (sVar3 == 0) {
    bVar2 = false;
  }
  else {
    uVar4 = 1;
    do {
      ComponentEntity::component
                (&local_50,
                 (size_t)(componentEntity->
                         super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      bVar1 = ImportedEntity::isImport
                        ((ImportedEntity *)
                         ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.
                                _vptr_Entity + 0x10));
      bVar2 = true;
      if (!bVar1) {
        local_40.super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 local_50.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_40.super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        bVar2 = hasComponentImports(&local_40);
        if (local_40.
            super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.
                     super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      sVar3 = ComponentEntity::componentCount
                        ((componentEntity->
                         super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      bVar1 = uVar4 < sVar3;
      uVar4 = uVar4 + 1;
    } while (bVar1 && bVar2 == false);
  }
  return bVar2;
}

Assistant:

bool hasComponentImports(const ComponentEntityConstPtr &componentEntity)
{
    bool importsPresent = false;
    for (size_t index = 0; (index < componentEntity->componentCount()) && !importsPresent; ++index) {
        libcellml::ComponentPtr childComponent = componentEntity->component(index);
        importsPresent = childComponent->isImport();
        if (!importsPresent) {
            importsPresent = hasComponentImports(childComponent);
        }
    }
    return importsPresent;
}